

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O3

string * google::protobuf::compiler::js::anon_unknown_0::ToLower
                   (string *__return_storage_ptr__,string *input)

{
  string *psVar1;
  ulong uVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  psVar1 = (string *)std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  if (input->_M_string_length != 0) {
    uVar2 = 0;
    do {
      psVar1 = (string *)std::__cxx11::string::push_back((char)__return_storage_ptr__);
      uVar2 = uVar2 + 1;
    } while (uVar2 < input->_M_string_length);
  }
  return psVar1;
}

Assistant:

std::string ToLower(const std::string& input) {
  std::string result;
  result.reserve(input.size());

  for (int i = 0; i < input.size(); i++) {
    if ('A' <= input[i] && input[i] <= 'Z') {
      result.push_back(input[i] - 'A' + 'a');
    } else {
      result.push_back(input[i]);
    }
  }

  return result;
}